

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void plot_game_window(tgestate_t *state)

{
  byte bVar1;
  ushort uVar2;
  zxspectrum_t *pzVar3;
  char cVar4;
  uint8_t *puVar5;
  uint16_t *puVar6;
  long lVar7;
  byte *pbVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  
  pzVar3 = state->speccy;
  puVar5 = state->window_buf;
  if ((state->game_window_offset).y != '\0') {
    bVar11 = (state->game_window_offset).x;
    pbVar8 = puVar5 + bVar11;
    cVar4 = -0x80;
    puVar6 = game_window_start_offsets;
    puVar5 = puVar5 + bVar11;
    do {
      uVar2 = *puVar6;
      lVar7 = 0;
      bVar11 = *pbVar8;
      do {
        lVar9 = lVar7;
        bVar1 = puVar5[lVar9 + 1];
        (pzVar3->screen).pixels[lVar9 + (ulong)uVar2] = bVar11 << 4 | bVar1 >> 4;
        lVar7 = lVar9 + 1;
        bVar11 = bVar1;
      } while ((char)(lVar9 + 1) != '\x17');
      puVar6 = puVar6 + 1;
      pbVar8 = puVar5 + lVar9 + 2;
      cVar4 = cVar4 + -1;
      puVar5 = puVar5 + lVar9 + 2;
    } while (cVar4 != '\0');
    (*state->speccy->draw)(state->speccy,&plot_game_window::dirty);
    return;
  }
  puVar5 = puVar5 + (ulong)(state->game_window_offset).x + 1;
  lVar7 = 0;
  do {
    uVar10 = (ulong)game_window_start_offsets[lVar7];
    (pzVar3->screen).pixels[uVar10] = *puVar5;
    (pzVar3->screen).pixels[uVar10 + 1] = puVar5[1];
    (pzVar3->screen).pixels[uVar10 + 2] = puVar5[2];
    (pzVar3->screen).pixels[uVar10 + 3] = puVar5[3];
    (pzVar3->screen).pixels[uVar10 + 4] = puVar5[4];
    (pzVar3->screen).pixels[uVar10 + 5] = puVar5[5];
    (pzVar3->screen).pixels[uVar10 + 6] = puVar5[6];
    (pzVar3->screen).pixels[uVar10 + 7] = puVar5[7];
    (pzVar3->screen).pixels[uVar10 + 8] = puVar5[8];
    (pzVar3->screen).pixels[uVar10 + 9] = puVar5[9];
    (pzVar3->screen).pixels[uVar10 + 10] = puVar5[10];
    (pzVar3->screen).pixels[uVar10 + 0xb] = puVar5[0xb];
    (pzVar3->screen).pixels[uVar10 + 0xc] = puVar5[0xc];
    (pzVar3->screen).pixels[uVar10 + 0xd] = puVar5[0xd];
    (pzVar3->screen).pixels[uVar10 + 0xe] = puVar5[0xe];
    (pzVar3->screen).pixels[uVar10 + 0xf] = puVar5[0xf];
    (pzVar3->screen).pixels[uVar10 + 0x10] = puVar5[0x10];
    (pzVar3->screen).pixels[uVar10 + 0x11] = puVar5[0x11];
    (pzVar3->screen).pixels[uVar10 + 0x12] = puVar5[0x12];
    (pzVar3->screen).pixels[uVar10 + 0x13] = puVar5[0x13];
    (pzVar3->screen).pixels[uVar10 + 0x14] = puVar5[0x14];
    (pzVar3->screen).pixels[uVar10 + 0x15] = puVar5[0x15];
    (pzVar3->screen).pixels[uVar10 + 0x16] = puVar5[0x16];
    puVar5 = puVar5 + 0x18;
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void plot_game_window(tgestate_t *state)
{
  uint8_t *const  screen = &state->speccy->screen.pixels[0];

  uint8_t         y;         /* was A */
  const uint8_t  *src;       /* was HL */
  const uint16_t *offsets;   /* was SP */
  uint8_t         y_iters_A; /* was A */
  uint8_t        *dst;       /* was DE */
  uint8_t         prev;      /* was A */
  uint8_t         y_iters_B; /* was B' */
  uint8_t         iters;     /* was B */
  uint8_t         tmp;       /* Conv: added for RRD macro */

  assert(state->game_window_offset.x == 0 * 24 ||
         state->game_window_offset.x == 2 * 24 ||
         state->game_window_offset.x == 4 * 24 ||
         state->game_window_offset.x == 6 * 24);

  y = state->game_window_offset.y; // might not be a Y value. seems to only ever be 0 or 255.
  assert(y == 0 || y == 255);
  if (y == 0)
  {
    src = &state->window_buf[1] + state->game_window_offset.x;
    ASSERT_WINDOW_BUF_PTR_VALID(src, 0);
    offsets = &game_window_start_offsets[0];
    y_iters_A = 128; /* iterations */
    do
    {
      dst = screen + *offsets++;
      ASSERT_SCREEN_PTR_VALID(dst);

      *dst++ = *src++; /* unrolled: 23 copies */
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      *dst++ = *src++;
      src++; // skip 24th
    }
    while (--y_iters_A);
  }
  else
  {
    src = &state->window_buf[0] + state->game_window_offset.x;
    ASSERT_WINDOW_BUF_PTR_VALID(src, 0);
    prev = *src++;
    offsets = &game_window_start_offsets[0];
    y_iters_B = 128; /* iterations */
    do
    {
      dst = screen + *offsets++;
      ASSERT_SCREEN_PTR_VALID(dst);

      /* Conv: Unrolling removed compared to original code which did 4 groups of 5 ops, then a final 3. */
      iters = 4 * 5 + 3; /* 23 iterations */
      do
      {
        /* Conv: Original code banks and shuffles registers to preserve stuff. This is simplified. */

        tmp = prev & 0x0F;
        prev = *src; // save pixel so we can use the bottom nibble next time around
        *dst++ = (*src++ >> 4) | (tmp << 4);
      }
      while (--iters);

      prev = *src++;
    }
    while (--y_iters_B);
  }

  {
    static const zxbox_t dirty = { 7*8, 6*8, 30*8, 22*8 };
    state->speccy->draw(state->speccy, &dirty);
  }
}